

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O0

void __thiscall
ObserverManager_TwoProtocolsManualUnsubscribe_Test::
~ObserverManager_TwoProtocolsManualUnsubscribe_Test
          (ObserverManager_TwoProtocolsManualUnsubscribe_Test *this)

{
  ObserverManager_TwoProtocolsManualUnsubscribe_Test *this_local;
  
  ~ObserverManager_TwoProtocolsManualUnsubscribe_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ObserverManager, TwoProtocolsManualUnsubscribe) {
    std::stringstream out;
    
    B* b = new B(out);
    ObserverManager::subscribe<TicTacProtocol>(b);
    ObserverManager::subscribe<FooBarProtocol>(b);
    
    ObserverManager::notify(&TicTacProtocol::ticTac);
    ObserverManager::notify(&FooBarProtocol::bar, "Toe");
    
    //ObserverManager::unsubscribe(b2); - won't compile due to ambiguity

    ObserverManager::unsubscribe<TicTacProtocol>(b);
    
    ObserverManager::notify(&TicTacProtocol::ticTac);
    ObserverManager::notify(&FooBarProtocol::bar, "Toe");
    
    delete b;

    EXPECT_EQ("Tic Tac Toe Toe ", out.str());
}